

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderIntegerFunctionTests.cpp
# Opt level: O2

bool __thiscall
vkt::shaderexecutor::BitfieldReverseCaseInstance::compare
          (BitfieldReverseCaseInstance *this,void **inputs,void **outputs)

{
  char cVar1;
  pointer pSVar2;
  uint uVar3;
  ostream *poVar4;
  uint uVar5;
  Hex<8UL> hex;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  
  pSVar2 = (this->super_IntegerFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  cVar1 = (&DAT_009f53e8)[(ulong)*(uint *)((long)&(pSVar2->varType).m_data + 4) * 4];
  uVar3 = glu::getDataTypeScalarSize((pSVar2->varType).m_data.basic.type);
  uVar5 = (2 << (cVar1 - 1U & 0x1f)) - 1;
  uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 * 0x1000000;
  uVar5 = (uVar5 & 0xf0f0f0f) << 4 | uVar5 >> 4 & 0xf0f0f0f;
  uVar5 = (uVar5 >> 2 & 0x33333333) + (uVar5 & 0x33333333) * 4;
  uVar8 = 0;
  uVar6 = 0;
  if (0 < (int)uVar3) {
    uVar6 = (ulong)uVar3;
  }
  do {
    if (uVar6 == uVar8) {
LAB_007a9822:
      return (long)(int)uVar3 <= (long)uVar8;
    }
    uVar7 = *(uint *)((long)*inputs + uVar8 * 4);
    uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
    uVar7 = (uVar7 & 0xf0f0f0f) << 4 | uVar7 >> 4 & 0xf0f0f0f;
    uVar7 = (uVar7 >> 2 & 0x33333333) + (uVar7 & 0x33333333) * 4;
    uVar7 = (uVar7 >> 1 & 0x55555555) + (uVar7 & 0x55555555) * 2;
    if (((*(uint *)((long)*outputs + uVar8 * 4) ^ uVar7) &
        (uVar5 >> 1 & 0x55555555) + (uVar5 & 0x55555555) * 2) != 0) {
      poVar4 = std::operator<<((ostream *)&(this->super_IntegerFunctionTestInstance).m_failMsg,
                               "Expected [");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)uVar8);
      poVar4 = std::operator<<(poVar4,"] = ");
      hex.value._4_4_ = 0;
      hex.value._0_4_ = uVar7;
      tcu::Format::operator<<(poVar4,hex);
      goto LAB_007a9822;
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				integerLength	= getShaderUintBitCount(m_shaderType, precision);
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		const deUint32			cmpMask			= reverseBits(getLowBitMask(integerLength));

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const deUint32	value	= ((const deUint32*)inputs[0])[compNdx];
			const deInt32	out		= ((const deUint32*)outputs[0])[compNdx];
			const deUint32	ref		= reverseBits(value);

			if ((out&cmpMask) != (ref&cmpMask))
			{
				m_failMsg << "Expected [" << compNdx << "] = " << tcu::toHex(ref);
				return false;
			}
		}

		return true;
	}